

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

void __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0,void,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&>
          (functional_internal *this,VoidPtr ptr,type args,type args_1)

{
  Nonnull<std::string_*> dest;
  bool bVar1;
  Cord *this_00;
  Cord *pCVar2;
  string_view src;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  string local_188;
  string local_168;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  AlphaNum local_f0;
  VoidPtr local_c0;
  size_t local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  this_00 = (Cord *)args._M_str;
  local_148._M_engaged = false;
  pCVar2 = this_00;
  if ((code *)**(undefined8 **)this != (code *)0x0) {
    (*(code *)**(undefined8 **)this)(&local_120,ptr.obj,args._M_len);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign(&local_148,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_120._M_value);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_120._M_value);
  }
  dest = *(Nonnull<std::string_*> *)(this + 8);
  local_120._0_16_ = (undefined1  [16])NullSafeStringView(" [");
  local_c0 = ptr;
  local_b8 = args._M_len;
  local_f0.piece_ = NullSafeStringView("=\'");
  bVar1 = local_148._M_engaged;
  if (local_148._M_engaged == true) {
    std::__cxx11::string::string((string *)&local_188,(string *)&local_148);
  }
  else {
    Cord::operator_cast_to_string(&local_168,this_00);
    src._M_str = (char *)pCVar2;
    src._M_len = (size_t)local_168._M_dataplus._M_p;
    CHexEscape_abi_cxx11_(&local_188,(lts_20250127 *)local_168._M_string_length,src);
  }
  local_60.piece_._M_len = local_188._M_string_length;
  local_60.piece_._M_str = local_188._M_dataplus._M_p;
  local_90.piece_ = NullSafeStringView("\']");
  StrAppend<>(dest,(AlphaNum *)&local_120._M_value,(AlphaNum *)&local_c0,&local_f0,&local_60,
              &local_90);
  std::__cxx11::string::~string((string *)&local_188);
  if (bVar1 == false) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_148);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}